

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void restassign(LexState *ls,LHS_assign *lh,int nvars)

{
  expdesc *e_00;
  l_uint32 *plVar1;
  byte bVar2;
  expkind eVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  OpCode o;
  FuncState *pFVar7;
  expdesc e;
  
  if (6 < (lh->v).k - VLOCAL) {
    luaX_syntaxerror(ls,"syntax error");
  }
  e_00 = &lh->v;
  check_readonly(ls,e_00);
  iVar6 = testnext(ls,0x2c);
  if (iVar6 == 0) {
    checknext(ls,0x3d);
    iVar6 = explist(ls,&e);
    if (iVar6 == nvars) {
      luaK_setoneret(ls->fs,&e);
      pFVar7 = ls->fs;
      goto LAB_0012da6e;
    }
    adjust_assign(ls,nvars,iVar6,&e);
  }
  else {
    e._0_8_ = lh;
    suffixedexp(ls,(expdesc *)&e.u.ind);
    if ((e.u.info & 0xfffffffcU) != 0xc) {
      pFVar7 = ls->fs;
      bVar2 = pFVar7->freereg;
      bVar4 = false;
      for (; bVar5 = (byte)e.t, lh != (LHS_assign *)0x0; lh = lh->prev) {
        eVar3 = (lh->v).k;
        if ((eVar3 & ~VFALSE) == VINDEXED) {
          if (eVar3 == VINDEXUP) {
            if ((e.u.info == 10) && (e.t == (uint)(lh->v).u.ind.t)) {
              (lh->v).k = VINDEXSTR;
              (lh->v).u.ind.t = bVar2;
LAB_0012d9b3:
              bVar4 = true;
            }
          }
          else if (e.u.info == 9) {
            if ((lh->v).u.ind.t == bVar5) {
              (lh->v).u.ind.t = bVar2;
              bVar4 = true;
            }
            if ((eVar3 == VINDEXED) && ((lh->v).u.ind.idx == (ushort)bVar5)) {
              *(ushort *)&(lh->v).u = (ushort)bVar2;
              goto LAB_0012d9b3;
            }
          }
        }
      }
      if (bVar4) {
        if (e.u.info == 9) {
          e.t = (int)bVar5;
          o = OP_MOVE;
        }
        else {
          o = OP_GETUPVAL;
        }
        luaK_codeABCk(pFVar7,o,(uint)bVar2,e.t,0,0);
        luaK_reserveregs(pFVar7,1);
      }
    }
    luaE_incCstack(ls->L);
    restassign(ls,(LHS_assign *)&e,nvars + 1);
    plVar1 = &ls->L->nCcalls;
    *plVar1 = *plVar1 - 1;
  }
  pFVar7 = ls->fs;
  e.t = -1;
  e.f = -1;
  e.u.info = pFVar7->freereg - 1;
  e.k = VNONRELOC;
LAB_0012da6e:
  luaK_storevar(pFVar7,e_00,&e);
  return;
}

Assistant:

static void restassign (LexState *ls, struct LHS_assign *lh, int nvars) {
  expdesc e;
  check_condition(ls, vkisvar(lh->v.k), "syntax error");
  check_readonly(ls, &lh->v);
  if (testnext(ls, ',')) {  /* restassign -> ',' suffixedexp restassign */
    struct LHS_assign nv;
    nv.prev = lh;
    suffixedexp(ls, &nv.v);
    if (!vkisindexed(nv.v.k))
      check_conflict(ls, lh, &nv.v);
    enterlevel(ls);  /* control recursion depth */
    restassign(ls, &nv, nvars+1);
    leavelevel(ls);
  }
  else {  /* restassign -> '=' explist */
    int nexps;
    checknext(ls, '=');
    nexps = explist(ls, &e);
    if (nexps != nvars)
      adjust_assign(ls, nvars, nexps, &e);
    else {
      luaK_setoneret(ls->fs, &e);  /* close last expression */
      luaK_storevar(ls->fs, &lh->v, &e);
      return;  /* avoid default */
    }
  }
  init_exp(&e, VNONRELOC, ls->fs->freereg-1);  /* default assignment */
  luaK_storevar(ls->fs, &lh->v, &e);
}